

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_explain.cpp
# Opt level: O2

ExplainFormat duckdb::ParseFormat(Value *val)

{
  ExplainFormat EVar1;
  iterator iVar2;
  InvalidInputException *pIVar3;
  long lVar4;
  __node_base *p_Var5;
  allocator local_1be;
  undefined1 local_1bd;
  undefined1 local_1bc;
  undefined1 local_1bb;
  ExplainFormat local_1ba [2];
  string local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  options_list;
  string format_val;
  case_insensitive_map_t<ExplainFormat> format_mapping;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string allowed_options;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>
  local_48;
  
  if ((val->type_).id_ != VARCHAR) {
    pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&allowed_options,"Expected a string as argument to FORMAT",
               (allocator *)&format_mapping);
    InvalidInputException::InvalidInputException(pIVar3,&allowed_options);
    __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  Value::GetValue<std::__cxx11::string>(&format_val,val);
  local_1b8._M_dataplus._M_p._0_1_ = 0;
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>
  ::pair<const_char_(&)[8],_duckdb::ExplainFormat,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>
              *)&allowed_options,(char (*) [8])0x1053517,(ExplainFormat *)&local_1b8);
  options_list.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(options_list.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>
  ::pair<const_char_(&)[5],_duckdb::ExplainFormat,_true>
            (&local_c0,(char (*) [5])0x114d2cd,(ExplainFormat *)&options_list);
  local_1be = (allocator)0x2;
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>
  ::pair<const_char_(&)[5],_duckdb::ExplainFormat,_true>
            (&local_98,(char (*) [5])0x103b31a,(ExplainFormat *)&local_1be);
  local_1ba[1] = 3;
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>
  ::pair<const_char_(&)[5],_duckdb::ExplainFormat,_true>
            (&local_70,(char (*) [5])0xf87776,local_1ba + 1);
  local_1ba[0] = GRAPHVIZ;
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>
  ::pair<const_char_(&)[9],_duckdb::ExplainFormat,_true>
            (&local_48,(char (*) [9])"graphviz",local_1ba);
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::ExplainFormat>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::ExplainFormat>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,duckdb::ExplainFormat>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::ExplainFormat>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::ExplainFormat>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&format_mapping,&allowed_options,&stack0xffffffffffffffe0,0,&local_1bb,&local_1bc,
             &local_1bd);
  lVar4 = 0xa0;
  do {
    ::std::__cxx11::string::~string((string *)((long)&allowed_options._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x28;
  } while (lVar4 != -0x28);
  iVar2 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&format_mapping._M_h,&format_val);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>,_true>
      ._M_cur != (__node_type *)0x0) {
    EVar1 = *(ExplainFormat *)
             ((long)iVar2.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>,_true>
                    ._M_cur + 0x28);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&format_mapping._M_h);
    ::std::__cxx11::string::~string((string *)&format_val);
    return EVar1;
  }
  options_list.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options_list.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  options_list.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var5 = &format_mapping._M_h._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&options_list,(value_type *)(p_Var5 + 1));
  }
  ::std::__cxx11::string::string((string *)&local_1b8,", ",&local_1be);
  StringUtil::Join(&allowed_options,&options_list,&local_1b8);
  ::std::__cxx11::string::~string((string *)&local_1b8);
  pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_1b8,"\"%s\" is not a valid FORMAT argument, valid options are: %s",
             &local_1be);
  ::std::__cxx11::string::string((string *)&local_108,(string *)&format_val);
  ::std::__cxx11::string::string((string *)&local_128,(string *)&allowed_options);
  InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
            (pIVar3,&local_1b8,&local_108,&local_128);
  __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ExplainFormat ParseFormat(const Value &val) {
	if (val.type().id() != LogicalTypeId::VARCHAR) {
		throw InvalidInputException("Expected a string as argument to FORMAT");
	}
	auto format_val = val.GetValue<string>();
	case_insensitive_map_t<ExplainFormat> format_mapping {
	    {"default", ExplainFormat::DEFAULT}, {"text", ExplainFormat::TEXT},         {"json", ExplainFormat::JSON},
	    {"html", ExplainFormat::HTML},       {"graphviz", ExplainFormat::GRAPHVIZ},
	};
	auto it = format_mapping.find(format_val);
	if (it != format_mapping.end()) {
		return it->second;
	}
	vector<string> options_list;
	for (auto &it : format_mapping) {
		options_list.push_back(it.first);
	}
	auto allowed_options = StringUtil::Join(options_list, ", ");
	throw InvalidInputException("\"%s\" is not a valid FORMAT argument, valid options are: %s", format_val,
	                            allowed_options);
}